

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexResult> *
wasm::WATParser::anon_unknown_0::space
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  size_t sVar2;
  LexResult *pLVar3;
  char *in_RCX;
  string_view sVar4;
  string_view in_00;
  anon_unknown_0 *local_90;
  char *local_88;
  undefined1 local_80 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  char *local_60;
  undefined1 local_58 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  undefined1 local_30 [8];
  LexCtx ctx;
  string_view in_local;
  
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = in._M_len;
  ctx.lexedSize =
       lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
       _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
       _16_8_;
  LexCtx::LexCtx((LexCtx *)local_30,in);
  while (sVar2 = LexCtx::size((LexCtx *)local_30), sVar2 != 0) {
    join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_30);
    sVar4._M_str = in_RCX;
    sVar4._M_len = (size_t)local_60;
    spacechar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_58,
              (anon_unknown_0 *)
              lexed_1.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
              ,sVar4);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
    if (bVar1) {
      pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_58);
      LexCtx::take((LexCtx *)local_30,pLVar3);
    }
    else {
      sVar4 = LexCtx::next((LexCtx *)local_30);
      local_90 = (anon_unknown_0 *)sVar4._M_len;
      local_88 = sVar4._M_str;
      in_00._M_str = in_RCX;
      in_00._M_len = (size_t)local_88;
      comment((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_80,local_90,in_00
             );
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_80);
      if (!bVar1) break;
      pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_80);
      LexCtx::take((LexCtx *)local_30,pLVar3);
    }
  }
  LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> space(std::string_view in) {
  LexCtx ctx(in);
  while (ctx.size()) {
    if (auto lexed = spacechar(ctx.next())) {
      ctx.take(*lexed);
    } else if (auto lexed = comment(ctx.next())) {
      ctx.take(*lexed);
    } else {
      break;
    }
  }
  return ctx.lexed();
}